

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O0

void * mspace_malloc(mspace msp,size_t bytes)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  size_t sVar8;
  void *pvVar9;
  byte bVar10;
  bool bVar11;
  ulong local_f0;
  mchunkptr r_2;
  mchunkptr p_3;
  size_t rsize_2;
  size_t dvs;
  mchunkptr r_1;
  mchunkptr p_2;
  size_t rsize_1;
  mchunkptr F_2;
  mchunkptr B;
  bindex_t I;
  mchunkptr DV;
  size_t DVS;
  mchunkptr F_1;
  uint J;
  binmap_t leastbit;
  binmap_t leftbits;
  bindex_t i;
  size_t rsize;
  mchunkptr r;
  mchunkptr p_1;
  mchunkptr b_1;
  mchunkptr F;
  mchunkptr p;
  mchunkptr b;
  binmap_t smallbits;
  bindex_t idx;
  size_t nb;
  void *mem;
  mstate ms;
  size_t bytes_local;
  mspace msp_local;
  
  if (bytes < 0xe9) {
    if (bytes < 0x17) {
      local_f0 = 0x20;
    }
    else {
      local_f0 = bytes + 0x17 & 0xfffffffffffffff0;
    }
    _smallbits = local_f0;
    bVar10 = (byte)(local_f0 >> 3);
    uVar3 = *msp >> (bVar10 & 0x1f);
    if ((uVar3 & 3) != 0) {
      iVar4 = ((uVar3 ^ 0xffffffff) & 1) + (int)(local_f0 >> 3);
      uVar5 = (long)msp + (ulong)(uint)(iVar4 * 2) * 8 + 0x48;
      lVar1 = *(long *)(uVar5 + 0x10);
      uVar6 = *(ulong *)(lVar1 + 0x10);
      if (uVar5 == uVar6) {
        *(uint *)msp = (1 << ((byte)iVar4 & 0x1f) ^ 0xffffffffU) & *msp;
      }
      else {
        bVar11 = false;
        if (*(ulong *)((long)msp + 0x18) <= uVar6) {
          bVar11 = *(long *)(uVar6 + 0x18) == lVar1;
        }
        if (!bVar11) {
          abort();
        }
        *(ulong *)(uVar6 + 0x18) = uVar5;
        *(ulong *)(uVar5 + 0x10) = uVar6;
      }
      *(ulong *)(lVar1 + 8) = (ulong)(uint)(iVar4 * 8) | 3;
      *(ulong *)(lVar1 + 8 + (ulong)(uint)(iVar4 * 8)) =
           *(ulong *)(lVar1 + 8 + (ulong)(uint)(iVar4 * 8)) | 1;
      return (void *)(lVar1 + 0x10);
    }
    if (local_f0 <= *(ulong *)((long)msp + 8)) goto LAB_0016b6a2;
    if (uVar3 != 0) {
      uVar3 = uVar3 << (bVar10 & 0x1f) & ((1 << (bVar10 & 0x1f)) << 1 | (1 << (bVar10 & 0x1f)) * -2)
      ;
      iVar4 = 0;
      for (uVar3 = uVar3 & -uVar3; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x80000000) {
        iVar4 = iVar4 + 1;
      }
      uVar5 = (long)msp + (ulong)(uint)(iVar4 << 1) * 8 + 0x48;
      lVar1 = *(long *)(uVar5 + 0x10);
      uVar6 = *(ulong *)(lVar1 + 0x10);
      if (uVar5 == uVar6) {
        *(uint *)msp = (1 << ((byte)iVar4 & 0x1f) ^ 0xffffffffU) & *msp;
      }
      else {
        bVar11 = false;
        if (*(ulong *)((long)msp + 0x18) <= uVar6) {
          bVar11 = *(long *)(uVar6 + 0x18) == lVar1;
        }
        if (!bVar11) {
          abort();
        }
        *(ulong *)(uVar6 + 0x18) = uVar5;
        *(ulong *)(uVar5 + 0x10) = uVar6;
      }
      uVar6 = (uint)(iVar4 << 3) - local_f0;
      if (uVar6 < 0x20) {
        *(ulong *)(lVar1 + 8) = (ulong)(uint)(iVar4 << 3) | 3;
        *(ulong *)(lVar1 + 8 + (ulong)(uint)(iVar4 << 3)) =
             *(ulong *)(lVar1 + 8 + (ulong)(uint)(iVar4 << 3)) | 1;
      }
      else {
        *(ulong *)(lVar1 + 8) = local_f0 | 3;
        lVar7 = lVar1 + local_f0;
        *(ulong *)(lVar7 + 8) = uVar6 | 1;
        *(ulong *)(lVar7 + uVar6) = uVar6;
        if (*(ulong *)((long)msp + 8) != 0) {
          lVar2 = *(long *)((long)msp + 0x20);
          uVar5 = *(ulong *)((long)msp + 8) >> 3;
          sVar8 = (long)msp + (ulong)(uint)((int)uVar5 << 1) * 8 + 0x48;
          bVar10 = (byte)uVar5;
          if ((*msp & 1 << (bVar10 & 0x1f)) == 0) {
            *(uint *)msp = 1 << (bVar10 & 0x1f) | *msp;
            rsize_1 = sVar8;
          }
          else {
            if (*(ulong *)(sVar8 + 0x10) < *(ulong *)((long)msp + 0x18)) {
              abort();
            }
            rsize_1 = *(size_t *)(sVar8 + 0x10);
          }
          *(long *)(sVar8 + 0x10) = lVar2;
          *(long *)(rsize_1 + 0x18) = lVar2;
          *(size_t *)(lVar2 + 0x10) = rsize_1;
          *(size_t *)(lVar2 + 0x18) = sVar8;
        }
        *(ulong *)((long)msp + 8) = uVar6;
        *(long *)((long)msp + 0x20) = lVar7;
      }
      return (void *)(lVar1 + 0x10);
    }
    if (*(int *)((long)msp + 4) == 0) goto LAB_0016b6a2;
    pvVar9 = tmalloc_small((mstate)msp,local_f0);
  }
  else {
    if (0xffffffffffffff7f < bytes) {
      _smallbits = 0xffffffffffffffff;
      goto LAB_0016b6a2;
    }
    _smallbits = bytes + 0x17 & 0xfffffffffffffff0;
    if (*(int *)((long)msp + 4) == 0) goto LAB_0016b6a2;
    pvVar9 = tmalloc_large((mstate)msp,_smallbits);
  }
  if (pvVar9 != (void *)0x0) {
    return pvVar9;
  }
LAB_0016b6a2:
  if (*(ulong *)((long)msp + 8) < _smallbits) {
    if (_smallbits < *(ulong *)((long)msp + 0x10)) {
      uVar6 = *(long *)((long)msp + 0x10) - _smallbits;
      *(ulong *)((long)msp + 0x10) = uVar6;
      lVar1 = *(long *)((long)msp + 0x28);
      *(ulong *)((long)msp + 0x28) = lVar1 + _smallbits;
      *(ulong *)(lVar1 + _smallbits + 8) = uVar6 | 1;
      *(ulong *)(lVar1 + 8) = _smallbits | 3;
      nb = lVar1 + 0x10;
    }
    else {
      nb = (size_t)sys_alloc((mstate)msp,_smallbits);
    }
  }
  else {
    uVar6 = *(long *)((long)msp + 8) - _smallbits;
    lVar1 = *(long *)((long)msp + 0x20);
    if (uVar6 < 0x20) {
      uVar6 = *(ulong *)((long)msp + 8);
      *(undefined8 *)((long)msp + 8) = 0;
      *(undefined8 *)((long)msp + 0x20) = 0;
      *(ulong *)(lVar1 + 8) = uVar6 | 3;
      *(ulong *)(lVar1 + 8 + uVar6) = *(ulong *)(lVar1 + 8 + uVar6) | 1;
    }
    else {
      lVar7 = lVar1 + _smallbits;
      *(long *)((long)msp + 0x20) = lVar7;
      *(ulong *)((long)msp + 8) = uVar6;
      *(ulong *)(lVar7 + 8) = uVar6 | 1;
      *(ulong *)(lVar7 + uVar6) = uVar6;
      *(ulong *)(lVar1 + 8) = _smallbits | 3;
    }
    nb = lVar1 + 0x10;
  }
  return (void *)nb;
}

Assistant:

void* mspace_malloc(mspace msp, size_t bytes) {
  mstate ms = (mstate)msp;
  if (!ok_magic(ms)) {
    USAGE_ERROR_ACTION(ms,ms);
    return 0;
  }
  if (!PREACTION(ms)) {
    void* mem;
    size_t nb;
    if (bytes <= MAX_SMALL_REQUEST) {
      bindex_t idx;
      binmap_t smallbits;
      nb = (bytes < MIN_REQUEST)? MIN_CHUNK_SIZE : pad_request(bytes);
      idx = small_index(nb);
      smallbits = ms->smallmap >> idx;

      if ((smallbits & 0x3U) != 0) { /* Remainderless fit to a smallbin. */
        mchunkptr b, p;
        idx += ~smallbits & 1;       /* Uses next bin if idx empty */
        b = smallbin_at(ms, idx);
        p = b->fd;
        assert(chunksize(p) == small_index2size(idx));
        unlink_first_small_chunk(ms, b, p, idx);
        set_inuse_and_pinuse(ms, p, small_index2size(idx));
        mem = chunk2mem(p);
        check_malloced_chunk(ms, mem, nb);
        goto postaction;
      }

      else if (nb > ms->dvsize) {
        if (smallbits != 0) { /* Use chunk in next nonempty smallbin */
          mchunkptr b, p, r;
          size_t rsize;
          bindex_t i;
          binmap_t leftbits = (smallbits << idx) & left_bits(idx2bit(idx));
          binmap_t leastbit = least_bit(leftbits);
          compute_bit2idx(leastbit, i);
          b = smallbin_at(ms, i);
          p = b->fd;
          assert(chunksize(p) == small_index2size(i));
          unlink_first_small_chunk(ms, b, p, i);
          rsize = small_index2size(i) - nb;
          /* Fit here cannot be remainderless if 4byte sizes */
          if (SIZE_T_SIZE != 4 && rsize < MIN_CHUNK_SIZE)
            set_inuse_and_pinuse(ms, p, small_index2size(i));
          else {
            set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
            r = chunk_plus_offset(p, nb);
            set_size_and_pinuse_of_free_chunk(r, rsize);
            replace_dv(ms, r, rsize);
          }
          mem = chunk2mem(p);
          check_malloced_chunk(ms, mem, nb);
          goto postaction;
        }

        else if (ms->treemap != 0 && (mem = tmalloc_small(ms, nb)) != 0) {
          check_malloced_chunk(ms, mem, nb);
          goto postaction;
        }
      }
    }
    else if (bytes >= MAX_REQUEST)
      nb = MAX_SIZE_T; /* Too big to allocate. Force failure (in sys alloc) */
    else {
      nb = pad_request(bytes);
      if (ms->treemap != 0 && (mem = tmalloc_large(ms, nb)) != 0) {
        check_malloced_chunk(ms, mem, nb);
        goto postaction;
      }
    }

    if (nb <= ms->dvsize) {
      size_t rsize = ms->dvsize - nb;
      mchunkptr p = ms->dv;
      if (rsize >= MIN_CHUNK_SIZE) { /* split dv */
        mchunkptr r = ms->dv = chunk_plus_offset(p, nb);
        ms->dvsize = rsize;
        set_size_and_pinuse_of_free_chunk(r, rsize);
        set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
      }
      else { /* exhaust dv */
        size_t dvs = ms->dvsize;
        ms->dvsize = 0;
        ms->dv = 0;
        set_inuse_and_pinuse(ms, p, dvs);
      }
      mem = chunk2mem(p);
      check_malloced_chunk(ms, mem, nb);
      goto postaction;
    }

    else if (nb < ms->topsize) { /* Split top */
      size_t rsize = ms->topsize -= nb;
      mchunkptr p = ms->top;
      mchunkptr r = ms->top = chunk_plus_offset(p, nb);
      r->head = rsize | PINUSE_BIT;
      set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
      mem = chunk2mem(p);
      check_top_chunk(ms, ms->top);
      check_malloced_chunk(ms, mem, nb);
      goto postaction;
    }

    mem = sys_alloc(ms, nb);

  postaction:
    POSTACTION(ms);
    return mem;
  }

  return 0;
}